

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O3

void * bng_new(t_symbol *s,int argc,t_atom *argv)

{
  undefined1 *puVar1;
  t_iem_fstyle_flags tVar2;
  t_symbol *ptVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  t_iemgui *iemgui;
  _glist *p_Var8;
  _clock *p_Var9;
  _inlet *p_Var10;
  uint uVar11;
  int iVar12;
  int iVar13;
  t_float tVar14;
  t_float tVar15;
  double dVar16;
  undefined8 local_78;
  t_iemgui_drawfunctions local_68;
  
  iemgui = iemgui_new(bng_class);
  p_Var8 = canvas_getcurrent();
  iVar4 = sys_zoomfontheight(p_Var8->gl_font,1,0);
  p_Var8 = canvas_getcurrent();
  iVar5 = sys_zoomfontheight(p_Var8->gl_font,1,0);
  iVar12 = iemgui->x_fontsize;
  local_68.draw_new = bng_draw_new;
  local_68.draw_config = bng_draw_config;
  local_68.draw_iolets = (t_iemfunptr)0x0;
  local_68.draw_update = bng_draw_update;
  local_68.draw_select = bng_draw_select;
  local_68.draw_erase = (t_iemdrawfunptr)0x0;
  local_68.draw_move = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions(iemgui,&local_68);
  if (((((argc == 0xe) && (argv->a_type == A_FLOAT)) && (argv[1].a_type == A_FLOAT)) &&
      ((((argv[2].a_type == A_FLOAT && (argv[3].a_type == A_FLOAT)) &&
        ((argv[4].a_type - A_FLOAT < 2 &&
         ((argv[5].a_type - A_FLOAT < 2 && (argv[6].a_type - A_FLOAT < 2)))))) &&
       (argv[7].a_type == A_FLOAT)))) &&
     (((argv[8].a_type == A_FLOAT && (argv[9].a_type == A_FLOAT)) && (argv[10].a_type == A_FLOAT))))
  {
    tVar14 = atom_getfloatarg(0,0xe,argv);
    iVar4 = (int)tVar14;
    tVar14 = atom_getfloatarg(1,0xe,argv);
    iVar5 = (int)tVar14;
    tVar14 = atom_getfloatarg(2,0xe,argv);
    iVar13 = (int)tVar14;
    tVar14 = atom_getfloatarg(3,0xe,argv);
    iem_inttosymargs(&iemgui->x_isa,(int)tVar14);
    iemgui_new_getnames(iemgui,4,argv);
    tVar14 = atom_getfloatarg(7,0xe,argv);
    tVar15 = atom_getfloatarg(8,0xe,argv);
    local_78 = CONCAT44((int)tVar15,(int)tVar14);
    tVar14 = atom_getfloatarg(9,0xe,argv);
    iem_inttofstyle(&iemgui->x_fsf,(int)tVar14);
    tVar14 = atom_getfloatarg(10,0xe,argv);
    iVar12 = (int)tVar14;
    iemgui_all_loadcolors(iemgui,argv + 0xb,argv + 0xc,argv + 0xd);
  }
  else {
    iVar4 = iVar4 + 5;
    iemgui_new_getnames(iemgui,4,(t_atom *)0x0);
    local_78 = (ulong)(uint)(int)((double)(iVar5 * -8 + -0x28) / 15.0) << 0x20;
    iVar5 = 0xfa;
    iVar13 = 0x32;
  }
  tVar2 = iemgui->x_fsf;
  uVar6 = (uint)(iemgui->x_snd != (t_symbol *)0x0) << 7;
  ptVar3 = iemgui->x_rcv;
  uVar11 = (uint)(ptVar3 != (t_symbol *)0x0) << 6;
  iemgui->x_fsf = (t_iem_fstyle_flags)(uVar11 | (uint)tVar2 & 0xffffff3f | uVar6);
  *(undefined4 *)&iemgui[1].x_obj.te_g.g_pd = 0;
  if (((uint)tVar2 & 0x3f) == 1) {
    builtin_strncpy(iemgui->x_font,"helvetica",10);
LAB_001354cb:
    if (ptVar3 == (t_symbol *)0x0) goto LAB_001354df;
  }
  else {
    if (((uint)tVar2 & 0x3f) == 2) {
      builtin_strncpy(iemgui->x_font,"times",6);
      goto LAB_001354cb;
    }
    iemgui->x_fsf = (t_iem_fstyle_flags)(uVar11 | (uint)tVar2 & 0xffffff00 | uVar6);
    strcpy(iemgui->x_font,sys_font);
    if (((uint)iemgui->x_fsf & 0x40) == 0) goto LAB_001354df;
  }
  pd_bind((t_pd *)iemgui,iemgui->x_rcv);
LAB_001354df:
  iemgui->x_ldx = (undefined4)local_78;
  iemgui->x_ldy = local_78._4_4_;
  iVar7 = 4;
  if (4 < iVar12) {
    iVar7 = iVar12;
  }
  iemgui->x_fontsize = iVar7;
  iVar4 = iemgui_clip_size(iVar4);
  iemgui->x_w = iVar4;
  iVar12 = iVar5;
  if (iVar5 < iVar13) {
    iVar12 = iVar13;
  }
  iemgui->x_h = iVar4;
  if (iVar13 < iVar5) {
    iVar5 = iVar13;
  }
  iVar4 = 10;
  if (10 < iVar5) {
    iVar4 = iVar5;
  }
  iVar5 = 0x32;
  if (0x32 < iVar12) {
    iVar5 = iVar12;
  }
  *(int *)((long)&iemgui[1].x_obj.te_g.g_pd + 4) = iVar4;
  *(int *)&iemgui[1].x_obj.te_g.g_next = iVar5;
  puVar1 = &(iemgui->x_isa).field_0x3;
  *puVar1 = *puVar1 & 0xf7;
  iemgui_verify_snd_ne_rcv(iemgui);
  dVar16 = clock_getsystime();
  *(double *)&iemgui[1].x_obj.te_xpix = dVar16;
  p_Var9 = clock_new(iemgui,bng_tick_hld);
  iemgui[1].x_obj.te_binbuf = (_binbuf *)p_Var9;
  p_Var10 = (_inlet *)clock_new(iemgui,bng_tick_lck);
  iemgui[1].x_obj.te_inlet = p_Var10;
  iemgui_newzoom(iemgui);
  outlet_new(&iemgui->x_obj,&s_bang);
  return iemgui;
}

Assistant:

static void *bng_new(t_symbol *s, int argc, t_atom *argv)
{
    t_bng *x = (t_bng *)iemgui_new(bng_class);
    int a = IEM_GUI_DEFAULTSIZE;
    int ldx = 0, ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE;
    int fs = x->x_gui.x_fontsize;
    int ftbreak = IEM_BNG_DEFAULTBREAKFLASHTIME,
        fthold = IEM_BNG_DEFAULTHOLDFLASHTIME;

    IEMGUI_SETDRAWFUNCTIONS(x, bng);

    if((argc == 14)&&IS_A_FLOAT(argv,0)
       &&IS_A_FLOAT(argv,1)&&IS_A_FLOAT(argv,2)
       &&IS_A_FLOAT(argv,3)
       &&(IS_A_SYMBOL(argv,4)||IS_A_FLOAT(argv,4))
       &&(IS_A_SYMBOL(argv,5)||IS_A_FLOAT(argv,5))
       &&(IS_A_SYMBOL(argv,6)||IS_A_FLOAT(argv,6))
       &&IS_A_FLOAT(argv,7)&&IS_A_FLOAT(argv,8)
       &&IS_A_FLOAT(argv,9)&&IS_A_FLOAT(argv,10))
    {
        a = (int)atom_getfloatarg(0, argc, argv);
        fthold = (int)atom_getfloatarg(1, argc, argv);
        ftbreak = (int)atom_getfloatarg(2, argc, argv);
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(3, argc, argv));
        iemgui_new_getnames(&x->x_gui, 4, argv);
        ldx = (int)atom_getfloatarg(7, argc, argv);
        ldy = (int)atom_getfloatarg(8, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(9, argc, argv));
        fs = (int)atom_getfloatarg(10, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+11, argv+12, argv+13);
    }
    else iemgui_new_getnames(&x->x_gui, 4, 0);

    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    x->x_flashed = 0;
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }

    if (x->x_gui.x_fsf.x_rcv_able)
        pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;

    x->x_gui.x_fontsize = (fs < 4)?4:fs;
    x->x_gui.x_w = iemgui_clip_size(a);
    x->x_gui.x_h = x->x_gui.x_w;
    bng_check_minmax(x, ftbreak, fthold);
    x->x_gui.x_isa.x_locked = 0;
    iemgui_verify_snd_ne_rcv(&x->x_gui);
    x->x_lastflashtime = clock_getsystime();
    x->x_clock_hld = clock_new(x, (t_method)bng_tick_hld);
    x->x_clock_lck = clock_new(x, (t_method)bng_tick_lck);
    iemgui_newzoom(&x->x_gui);
    outlet_new(&x->x_gui.x_obj, &s_bang);
    return (x);
}